

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRle.cpp
# Opt level: O0

void anon_unknown.dwarf_214610::generateData(char *buffer,int bufferLen)

{
  int in_ESI;
  long in_RDI;
  double dVar1;
  int j;
  int runLen;
  Rand48 rand48;
  int i;
  char value;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  int in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  int iVar4;
  uint3 in_stack_fffffffffffffff0;
  uint uVar5;
  
  uVar5 = (uint)in_stack_fffffffffffffff0;
  iVar3 = 0;
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  do {
    if (in_ESI <= iVar3) {
      return;
    }
    dVar1 = Imath_3_2::Rand48::nextf((Rand48 *)0x1f6eb0);
    if (0.5 <= dVar1) {
      dVar1 = Imath_3_2::Rand48::nextf
                        ((Rand48 *)CONCAT44(in_ESI,uVar5),
                         (double)CONCAT44(iVar3,in_stack_ffffffffffffffe8),
                         (double)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      in_stack_ffffffffffffffe0 = (int)dVar1;
      iVar4 = iVar3;
      for (iVar2 = 0; iVar3 = iVar4, iVar2 < in_stack_ffffffffffffffe0; iVar2 = iVar2 + 1) {
        iVar3 = iVar4 + 1;
        *(char *)(in_RDI + iVar4) = (char)(uVar5 >> 0x18);
        if (in_ESI <= iVar3) break;
        iVar4 = iVar3;
      }
    }
    else {
      *(char *)(in_RDI + iVar3) = (char)(uVar5 >> 0x18);
      iVar3 = iVar3 + 1;
    }
    uVar5 = CONCAT13((char)(uVar5 >> 0x18) + '\x01',(int3)uVar5);
  } while( true );
}

Assistant:

void
generateData (char* buffer, int bufferLen)
{
    char   value = 0;
    int    i     = 0;
    Rand48 rand48 (0);

    while (i < bufferLen)
    {

        if (rand48.nextf () < .5)
        {

            // Insert a single value
            buffer[i++] = value;
        }
        else
        {

            // Insert a run
            int runLen = (int) rand48.nextf (2.0, 1024.0);

            for (int j = 0; j < runLen; ++j)
            {
                buffer[i++] = value;
                if (i >= bufferLen) break;
            }
        }

        value = (int) (value + 1) & 0xff;
    }
}